

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O1

void Sbd_ManSolveSelect(Gia_Man_t *p,Vec_Int_t *vMirrors,int Pivot,Vec_Int_t *vDivVars,
                       Vec_Int_t *vDivValues,Vec_Int_t *vWinObjs,Vec_Int_t *vObj2Var,Vec_Int_t *vTfo
                       ,Vec_Int_t *vRoots)

{
  int iVar1;
  Vec_Int_t *vSop;
  int *piVar2;
  Vec_Int_t *vTemp;
  sat_solver *pSat;
  long lVar3;
  uint uVar4;
  int nVars;
  int pInds [64];
  
  vSop = (Vec_Int_t *)malloc(0x10);
  vSop->nCap = 100;
  vSop->nSize = 0;
  piVar2 = (int *)malloc(400);
  vSop->pArray = piVar2;
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nCap = 100;
  vTemp->nSize = 0;
  piVar2 = (int *)malloc(400);
  vTemp->pArray = piVar2;
  pSat = Sbd_ManSatSolver((sat_solver *)0x0,p,vMirrors,Pivot,vWinObjs,vObj2Var,vTfo,vRoots,0);
  if ((-1 < Pivot) && (Pivot < vObj2Var->nSize)) {
    iVar1 = Sbd_ManSolve2(pSat,vObj2Var->pArray[(uint)Pivot],
                          vTfo->nSize + vWinObjs->nSize + vRoots->nSize,vDivVars,vDivValues,vTemp,
                          vSop);
    uVar4 = 0;
    printf("Pivot = %4d. Divs = %4d.  ",(ulong)(uint)Pivot,(ulong)(uint)vDivVars->nSize);
    if (iVar1 == 0) {
      puts("UNSAT.");
    }
    else {
      Sbd_ManSolverSupp(vSop,pInds,&nVars);
      if (0 < (long)vSop->nSize) {
        lVar3 = 0;
        uVar4 = 0;
        do {
          uVar4 = uVar4 + (vSop->pArray[lVar3] == -1);
          lVar3 = lVar3 + 1;
        } while (vSop->nSize != lVar3);
      }
      printf("SAT with %d vars and %d cubes.\n",(ulong)(uint)nVars,(ulong)uVar4);
    }
    if (vTemp->pArray != (int *)0x0) {
      free(vTemp->pArray);
      vTemp->pArray = (int *)0x0;
    }
    free(vTemp);
    if (vSop->pArray != (int *)0x0) {
      free(vSop->pArray);
      vSop->pArray = (int *)0x0;
    }
    free(vSop);
    sat_solver_delete(pSat);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Sbd_ManSolveSelect( Gia_Man_t * p, Vec_Int_t * vMirrors, int Pivot, Vec_Int_t * vDivVars, Vec_Int_t * vDivValues, Vec_Int_t * vWinObjs, Vec_Int_t * vObj2Var, Vec_Int_t * vTfo, Vec_Int_t * vRoots )
{
    Vec_Int_t * vSop = Vec_IntAlloc( 100 );
    Vec_Int_t * vTemp = Vec_IntAlloc( 100 );
    sat_solver * pSat = Sbd_ManSatSolver( NULL, p, vMirrors, Pivot, vWinObjs, vObj2Var, vTfo, vRoots, 0 );
    int PivotVar = Vec_IntEntry(vObj2Var, Pivot);
    int FreeVar = Vec_IntSize(vWinObjs) + Vec_IntSize(vTfo) + Vec_IntSize(vRoots);
    int Status = Sbd_ManSolve2( pSat, PivotVar, FreeVar, vDivVars, vDivValues, vTemp, vSop );
    printf( "Pivot = %4d. Divs = %4d.  ", Pivot, Vec_IntSize(vDivVars) );
    if ( Status == 0 )
        printf( "UNSAT.\n" );
    else
    {
        int nVars, pInds[64];
        word Supp = Sbd_ManSolverSupp( vSop, pInds, &nVars );
        //Sbd_ManSolverPrint( vSop );
        printf( "SAT with %d vars and %d cubes.\n", nVars, Vec_IntCountEntry(vSop, -1) );
        Supp = 0;
    }
    Vec_IntFree( vTemp );
    Vec_IntFree( vSop );
    sat_solver_delete( pSat );
}